

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O3

void llava_free(llava_context *ctx_llava)

{
  if (ctx_llava->ctx_clip != (clip_ctx *)0x0) {
    clip_free(ctx_llava->ctx_clip);
    ctx_llava->ctx_clip = (clip_ctx *)0x0;
  }
  llama_free(ctx_llava->ctx_llama);
  llama_model_free(ctx_llava->model);
  llama_backend_free();
  return;
}

Assistant:

static void llava_free(struct llava_context * ctx_llava) {
    if (ctx_llava->ctx_clip) {
        clip_free(ctx_llava->ctx_clip);
        ctx_llava->ctx_clip = NULL;
    }

    llama_free(ctx_llava->ctx_llama);
    llama_model_free(ctx_llava->model);
    llama_backend_free();
}